

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O2

Ivy_Man_t * Ivy_ManBalance(Ivy_Man_t *p,int fUpdateLevel)

{
  uint uVar1;
  Ivy_Man_t *p_00;
  void *pvVar2;
  Ivy_Obj_t *pIVar3;
  Vec_Vec_t *p_01;
  void **ppvVar4;
  Vec_Ptr_t *p_02;
  int i;
  int iVar5;
  
  Ivy_ManCleanTravId(p);
  p_00 = Ivy_ManStart();
  p->pConst1->TravId =
       ((uint)p_00->pConst1 & 1) + *(int *)((ulong)p_00->pConst1 & 0xfffffffffffffffe) * 2;
  for (iVar5 = 0; iVar5 < p->vPis->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vPis,iVar5);
    pIVar3 = Ivy_ObjCreatePi(p_00);
    *(uint *)((long)pvVar2 + 4) =
         ((uint)pIVar3 & 1) + *(int *)((ulong)pIVar3 & 0xfffffffffffffffe) * 2;
  }
  p_01 = (Vec_Vec_t *)malloc(0x10);
  p_01->nCap = 0x32;
  p_01->nSize = 0;
  ppvVar4 = (void **)malloc(400);
  p_01->pArray = ppvVar4;
  for (iVar5 = 0; iVar5 < p->vPos->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(p->vPos,iVar5);
    pIVar3 = Ivy_ObjReal(*(Ivy_Obj_t **)((long)pvVar2 + 0x10));
    uVar1 = Ivy_NodeBalance_rec(p_00,(Ivy_Obj_t *)((ulong)pIVar3 & 0xfffffffffffffffe),p_01,0,
                                fUpdateLevel);
    pIVar3 = Ivy_EdgeToNode(p_00,(uint)pIVar3 & 1 ^ uVar1);
    Ivy_ObjCreatePo(p_00,pIVar3);
  }
  iVar5 = p_01->nSize;
  i = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
    i = 0;
  }
  for (; iVar5 != i; i = i + 1) {
    p_02 = Vec_VecEntry(p_01,i);
    if (p_02 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(p_02);
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p_01);
  Ivy_ManCleanup(p_00);
  iVar5 = Ivy_ManCheck(p_00);
  if (iVar5 == 0) {
    puts("Ivy_ManBalance(): The check has failed.");
  }
  return p_00;
}

Assistant:

Ivy_Man_t * Ivy_ManBalance( Ivy_Man_t * p, int fUpdateLevel )
{
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj, * pDriver;
    Vec_Vec_t * vStore;
    int i, NewNodeId;
    // clean the old manager
    Ivy_ManCleanTravId( p );
    // create the new manager 
    pNew = Ivy_ManStart();
    // map the nodes
    Ivy_ManConst1(p)->TravId = Ivy_EdgeFromNode( Ivy_ManConst1(pNew) );
    Ivy_ManForEachPi( p, pObj, i )
        pObj->TravId = Ivy_EdgeFromNode( Ivy_ObjCreatePi(pNew) );
    // if HAIG is defined, trasfer the pointers to the PIs/latches
//    if ( p->pHaig )
//        Ivy_ManHaigTrasfer( p, pNew );
    // balance the AIG
    vStore = Vec_VecAlloc( 50 );
    Ivy_ManForEachPo( p, pObj, i )
    {
        pDriver   = Ivy_ObjReal( Ivy_ObjChild0(pObj) );
        NewNodeId = Ivy_NodeBalance_rec( pNew, Ivy_Regular(pDriver), vStore, 0, fUpdateLevel );
        NewNodeId = Ivy_EdgeNotCond( NewNodeId, Ivy_IsComplement(pDriver) );
        Ivy_ObjCreatePo( pNew, Ivy_EdgeToNode(pNew, NewNodeId) );
    }
    Vec_VecFree( vStore );
    if ( (i = Ivy_ManCleanup( pNew )) )
    {
//        printf( "Cleanup after balancing removed %d dangling nodes.\n", i );
    }
    // check the resulting AIG
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManBalance(): The check has failed.\n" );
    return pNew;
}